

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

result_type_conflict
time_plain<boost::random::mersenne_twister_engine<unsigned_int,32ul,351ul,175ul,19ul,3433795303u,11ul,4294967295u,7ul,834054912u,15ul,4293197824u,17ul,1812433253u>>
          (mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
           *r)

{
  result_type_conflict rVar1;
  ulong uVar2;
  time_t *in_RSI;
  string res;
  long i;
  long max;
  timer T;
  result_type_conflict s;
  double *in_stack_00000128;
  mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
  *in_stack_ffffffffffffff90;
  string local_50 [32];
  long local_30;
  long local_28;
  timer local_20;
  result_type_conflict local_c;
  
  local_c = 0;
  timer::timer((timer *)in_stack_ffffffffffffff90);
  local_28 = 0x1000000;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    rVar1 = boost::random::
            mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
            ::operator()(in_stack_ffffffffffffff90);
    local_c = rVar1 + local_c;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (9 < uVar2) break;
    std::__cxx11::string::operator+=(local_50,' ');
  }
  std::operator<<((ostream *)&std::cout,local_50);
  rVar1 = local_c;
  std::__cxx11::string::~string(local_50);
  return rVar1;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}